

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O0

Object * __thiscall LiteScript::_BasicMemory_1::CreateAt(_BasicMemory_1 *this,uint id)

{
  value_type_conflict1 vVar1;
  bool bVar2;
  uint uVar3;
  reference pp_Var4;
  _BasicMemory_0 *this_00;
  reference pvVar5;
  Object *pOVar6;
  uint local_34;
  uint j;
  Object *obj;
  uint block;
  uint id_local;
  _BasicMemory_1 *this_local;
  
  uVar3 = id >> 8;
  pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[](&this->arr,(ulong)uVar3);
  if (*pp_Var4 == (value_type)0x0) {
    this_00 = (_BasicMemory_0 *)operator_new(0x2f20);
    _BasicMemory_0::_BasicMemory_0(this_00,this->memory);
    pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[](&this->arr,(ulong)uVar3);
    *pp_Var4 = this_00;
    vVar1 = this->first_nfull;
    pvVar5 = std::array<short,_256UL>::operator[](&this->nfull,(ulong)uVar3);
    *pvVar5 = vVar1;
    this->first_nfull = (short)(id >> 8);
  }
  pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[](&this->arr,(ulong)uVar3);
  pOVar6 = _BasicMemory_0::CreateAt(*pp_Var4,id);
  this->count = this->count + 1;
  pp_Var4 = std::array<LiteScript::_BasicMemory_0_*,_256UL>::operator[](&this->arr,(ulong)uVar3);
  bVar2 = _BasicMemory_0::isFull(*pp_Var4);
  if (bVar2) {
    local_34 = 0;
    while( true ) {
      bVar2 = false;
      if (local_34 < 0x100) {
        pvVar5 = std::array<short,_256UL>::operator[](&this->nfull,(ulong)local_34);
        bVar2 = (int)*pvVar5 != uVar3;
      }
      if (!bVar2) break;
      local_34 = local_34 + 1;
    }
    if (local_34 == 0x100) {
      pvVar5 = std::array<short,_256UL>::operator[](&this->nfull,(ulong)uVar3);
      this->first_nfull = *pvVar5;
    }
    else {
      pvVar5 = std::array<short,_256UL>::operator[](&this->nfull,(ulong)uVar3);
      vVar1 = *pvVar5;
      pvVar5 = std::array<short,_256UL>::operator[](&this->nfull,(ulong)local_34);
      *pvVar5 = vVar1;
    }
  }
  return pOVar6;
}

Assistant:

LiteScript::Object& LiteScript::_BasicMemory_1::CreateAt(unsigned int id) {
    unsigned int block = id >> 8;
    if (this->arr[block] == nullptr) {
        this->arr[block] = new LiteScript::_BasicMemory_0(this->memory);
        this->nfull[block] = this->first_nfull;
        this->first_nfull = (short)block;
    }
    Object& obj = this->arr[block]->CreateAt(id);
    this->count++;
    if (this->arr[block]->isFull()) {
        unsigned int j;
        for (j = 0; j < LITESCRIPT_MEMORY_1_SIZE && this->nfull[j] != block; j++);
        if (j == LITESCRIPT_MEMORY_1_SIZE)
            this->first_nfull = this->nfull[block];
        else
            this->nfull[j] = this->nfull[block];
    }
    return obj;
}